

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_grasshopper_cipher.c
# Opt level: O1

int gost_grasshopper_cipher_init_mgm(EVP_CIPHER_CTX *ctx,uchar *key,uchar *iv,int enc)

{
  grasshopper_key_t *key_00;
  int iVar1;
  void *key_01;
  grasshopper_key_t *pgVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  
  key_01 = (void *)EVP_CIPHER_CTX_get_cipher_data();
  if (key == (uchar *)0x0 && iv == (uchar *)0x0) {
    return 1;
  }
  if (key == (uchar *)0x0) {
    if (*(int *)((long)key_01 + 0x1088) == 0) {
      memcpy(*(void **)((long)key_01 + 0x1158),iv,(long)*(int *)((long)key_01 + 0x1160));
    }
    else {
      iVar1 = gost_mgm128_setiv((mgm128_context *)((long)key_01 + 0x1090),iv,
                                (long)*(int *)((long)key_01 + 0x1160));
      if (iVar1 != 1) {
        return 0;
      }
    }
    *(undefined4 *)((long)key_01 + 0x108c) = 1;
  }
  else {
    iVar1 = EVP_CIPHER_CTX_get_iv_length(ctx);
    key_00 = (grasshopper_key_t *)((long)key_01 + 0x28);
    pgVar2 = key_00;
    lVar3 = 0;
    do {
      lVar4 = 0;
      do {
        (pgVar2->k).q[lVar4] = *(uint64_t *)(key + lVar4 * 8);
        lVar4 = lVar4 + 1;
      } while (lVar4 == 1);
      pgVar2 = (grasshopper_key_t *)((long)&pgVar2->k + 0x10);
      key = key + 0x10;
      bVar5 = lVar3 == 0;
      lVar3 = lVar3 + 1;
    } while (bVar5);
    grasshopper_set_encrypt_key((grasshopper_round_keys_t *)((long)key_01 + 0x48),key_00);
    grasshopper_set_decrypt_key((grasshopper_round_keys_t *)((long)key_01 + 0xe8),key_00);
    gost_mgm128_init((mgm128_context *)((long)key_01 + 0x1090),key_01,gost_grasshopper_encrypt_wrap,
                     gf128_mul_uint64,iVar1);
    if (iv == (uchar *)0x0) {
      if (*(int *)((long)key_01 + 0x108c) == 0) {
        iv = (uchar *)0x0;
      }
      else {
        iv = *(uchar **)((long)key_01 + 0x1158);
      }
    }
    if (iv != (uchar *)0x0) {
      iVar1 = gost_mgm128_setiv((mgm128_context *)((long)key_01 + 0x1090),iv,
                                (long)*(int *)((long)key_01 + 0x1160));
      if (iVar1 != 1) {
        return 0;
      }
      *(undefined4 *)((long)key_01 + 0x108c) = 1;
    }
    *(undefined4 *)((long)key_01 + 0x1088) = 1;
  }
  return 1;
}

Assistant:

static GRASSHOPPER_INLINE int
gost_grasshopper_cipher_init_mgm(EVP_CIPHER_CTX *ctx, const unsigned char *key,
                                 const unsigned char *iv, int enc)
{
    gost_mgm_ctx *mctx =
        (gost_mgm_ctx *)EVP_CIPHER_CTX_get_cipher_data(ctx);
    int bl;

    if (!iv && !key)
        return 1;
    if (key) {
        bl = EVP_CIPHER_CTX_iv_length(ctx);
        gost_grasshopper_cipher_key(&mctx->ks.gh_ks, key);
        gost_mgm128_init(&mctx->mgm, &mctx->ks,
                         (block128_f) gost_grasshopper_encrypt_wrap, gf128_mul_uint64, bl);

        /*
         * If we have an iv can set it directly, otherwise use saved IV.
         */
        if (iv == NULL && mctx->iv_set)
            iv = mctx->iv;
        if (iv) {
            if (gost_mgm128_setiv(&mctx->mgm, iv, mctx->ivlen) != 1)
                return 0;
            mctx->iv_set = 1;
        }
        mctx->key_set = 1;
    } else {
        /* If key set use IV, otherwise copy */
        if (mctx->key_set) {
            if (gost_mgm128_setiv(&mctx->mgm, iv, mctx->ivlen) != 1)
                return 0;
        }
        else
            memcpy(mctx->iv, iv, mctx->ivlen);
        mctx->iv_set = 1;
    }
    return 1;
}